

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

bool_t prf_model_load_with_callback(prf_model_t *model,bfile_t *bfile,prf_cb_t callback)

{
  byte *pbVar1;
  _func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *p_Var2;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  bool_t bVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined8 *id;
  void *pvVar12;
  prf_state_t *state;
  size_t sVar13;
  prf_node_t *node;
  prf_nodeinfo_t *ppVar14;
  uint8_t *buffer;
  char *pcVar15;
  size_t sVar16;
  ulong uVar17;
  bool bVar18;
  
  id = (undefined8 *)prf_array_init(8,8);
  pvVar12 = prf_array_init(8,8);
  *id = pvVar12;
  state = prf_state_create();
  state->model = model;
  bVar6 = bf_at_eof(bfile);
  if (bVar6 == 0) {
    uVar11 = 0;
    do {
      sVar13 = bf_get_remaining_length(bfile);
      if (sVar13 < 4) {
        pcVar15 = "would reach EOF before reading node header.";
LAB_00102e0e:
        prf_error(6,pcVar15);
        goto LAB_00102e1a;
      }
      if (model->mempool_id == 0) {
        node = prf_node_create();
        if (node == (prf_node_t *)0x0) goto LAB_00102e07;
      }
      else {
        node = (prf_node_t *)pool_malloc(model->mempool_id,0x28);
        if (node == (prf_node_t *)0x0) {
LAB_00102e07:
          pcVar15 = "could not allocate memory for new node.";
          goto LAB_00102e0e;
        }
        prf_node_clear(node);
        pbVar1 = (byte *)((long)&node->flags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      uVar3 = bf_peek_uint16_be(bfile);
      node->opcode = uVar3;
      if (uVar3 == 0x17) {
        prf_error(1,"detected continuation (>= 15.7) - unsupported");
        uVar3 = node->opcode;
      }
      uVar9 = (uint)uVar3;
      if (uVar3 < 0x3230) {
        if ((uVar3 != 0) && (uVar9 != 0xb)) goto LAB_00102b25;
LAB_00102abb:
        if (((int)uVar11 < 1) || (bVar18 = uVar3 != 0xb, uVar3 = 0xb, bVar18)) {
          sVar13 = bf_get_position(bfile);
          sVar16 = bf_get_length(bfile);
          prf_error(1,"bogus node opcode 0x%04x at level %d, location %d/%d",(ulong)uVar9,
                    (ulong)uVar11,sVar13,sVar16);
          if (uVar11 != 0) {
            prf_error(1,"since level != 0, can\'t assume trailing garbage");
            uVar3 = node->opcode;
            goto LAB_00102b25;
          }
          bf_at_eof(bfile);
          goto LAB_001029b8;
        }
      }
      else {
        if ((uVar3 == 0xa000) || (uVar3 == 0x3230)) goto LAB_00102abb;
LAB_00102b25:
        if (uVar3 == 0xb00) {
          uVar8 = bf_get_uint32_be(bfile);
          bf_unget_uint32_be(bfile,((uVar8 & 0xff00) << 8 | uVar8 << 0x18) >> 0x10 |
                                   (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8) << 0x10);
          uVar3 = bf_peek_uint16_be(bfile);
          node->opcode = uVar3;
        }
      }
      ppVar14 = prf_nodeinfo_get(uVar3);
      if ((ppVar14 == (prf_nodeinfo_t *)0x0) ||
         (p_Var2 = ppVar14->load_f,
         p_Var2 == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
        uVar4 = bf_get_uint16_be(bfile);
        node->opcode = uVar4;
        uVar4 = bf_get_uint16_be(bfile);
        node->length = uVar4;
        sVar13 = bf_get_remaining_length(bfile);
        if (sVar13 + 4 < (ulong)uVar4) goto LAB_00102e1a;
        if (4 < node->length) {
          uVar9 = node->length - 4;
          if (model->mempool_id == 0) {
            buffer = (uint8_t *)malloc((ulong)uVar9);
          }
          else {
            buffer = (uint8_t *)pool_malloc(model->mempool_id,uVar9);
            pbVar1 = (byte *)((long)&node->flags + 1);
            *pbVar1 = *pbVar1 | 1;
            uVar9 = node->length - 4;
          }
          node->data = buffer;
          bf_read(bfile,buffer,uVar9);
        }
        if (ppVar14 != (prf_nodeinfo_t *)0x0) goto LAB_00102c12;
        prf_debug(1,"node loaded: opcode %d, length %d",(ulong)node->opcode,(ulong)node->length);
      }
      else {
        state->node = node;
        bVar6 = (*p_Var2)(node,state,bfile);
        if (bVar6 == 0) {
LAB_00102e1a:
          uVar4 = bf_get_uint16_be(bfile);
          uVar5 = bf_get_uint16_be(bfile);
          bf_rewind(bfile,4);
          ppVar14 = prf_nodeinfo_get(uVar4);
          prf_error(9,"could not load model database.");
          if (ppVar14 == (prf_nodeinfo_t *)0x0) {
            prf_error(6,"  failed while loading node with opcode %d, length: %d",(ulong)uVar4,
                      (ulong)uVar5);
          }
          else {
            prf_error(6,"  failed while loading node \"%s\" (%d), length: %d",ppVar14->name,
                      (ulong)uVar4,(ulong)uVar5);
          }
          pcVar15 = bf_get_filename(bfile);
          sVar13 = bf_get_position(bfile);
          sVar16 = bf_get_length(bfile);
          prf_error(6,"  file: \"%s\", position: %d (of %d)",pcVar15,sVar13,sVar16);
          prf_debug(6,"dumping node data");
          bf_hex_dump(bfile,_stderr,(uint)uVar5,4);
          return 0;
        }
LAB_00102c12:
        prf_debug(1,"node loaded: \"%s\"",ppVar14->name);
      }
      uVar3 = ppVar14->flags;
      if ((uVar3 & 0x201) != 0) {
        iVar7 = prf_array_count((void *)id[(int)uVar11]);
        if (*(long *)(*(long *)(id[(int)uVar11] + -8 + (long)iVar7 * 8) + 0x10) == 0) {
          pvVar12 = prf_array_set_count(id,uVar11 + 1);
          id = (undefined8 *)prf_array_append_ptr(pvVar12,(void *)0x0);
          pvVar12 = prf_array_init(8,8);
          id[(long)(int)uVar11 + 1] = pvVar12;
        }
        uVar3 = ppVar14->flags;
        uVar11 = uVar11 + (uVar3 & 1);
      }
      if ((uVar3 >> 9 & 1) == 0) {
        pvVar12 = prf_array_append_ptr((void *)id[(int)uVar11],node);
        id[(int)uVar11] = pvVar12;
      }
      else {
        pvVar12 = prf_array_append_ptr((void *)id[(long)(int)uVar11 + 1],node);
        id[(long)(int)uVar11 + 1] = pvVar12;
        iVar7 = prf_array_count((void *)id[(int)uVar11]);
        pvVar12 = (void *)id[(long)(int)uVar11 + 1];
        *(void **)(*(long *)(id[(int)uVar11] + -8 + (long)iVar7 * 8) + 0x10) = pvVar12;
        uVar9 = prf_array_count(pvVar12);
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(undefined8 *)(*(long *)(id[(long)(int)uVar11 + 1] + uVar17 * 8) + 0x18) =
                 *(undefined8 *)(id[(int)uVar11] + ((long)iVar7 + -1) * 8);
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
        }
      }
      (*callback.func)(node,callback.data);
      uVar9 = uVar11;
      if ((ppVar14->flags & 2) != 0) {
        iVar7 = prf_array_count((void *)id[(long)(int)uVar11 + -1]);
        pvVar12 = (void *)id[(int)uVar11];
        *(void **)(*(long *)(id[(long)(int)uVar11 + -1] + -8 + (long)iVar7 * 8) + 0x10) = pvVar12;
        uVar10 = prf_array_count(pvVar12);
        uVar9 = uVar11 - 1;
        if (0 < (int)uVar10) {
          uVar17 = 0;
          do {
            *(undefined8 *)(*(long *)(id[(int)uVar11] + uVar17 * 8) + 0x18) =
                 *(undefined8 *)(id[(long)(int)uVar11 + -1] + ((long)iVar7 + -1) * 8);
            uVar17 = uVar17 + 1;
          } while (uVar10 != uVar17);
        }
      }
      uVar11 = uVar9;
      bVar6 = bf_at_eof(bfile);
    } while (bVar6 == 0);
    if (0 < (int)uVar11) {
      prf_warn(6,"loading model left state on level %d.");
    }
  }
LAB_001029b8:
  prf_state_destroy(state);
  iVar7 = prf_array_count((void *)*id);
  if (iVar7 != 1) {
    uVar11 = prf_array_count((undefined8 *)*id);
    prf_error(8,"model got multiple %d root nodes",(ulong)uVar11);
  }
  else {
    model->header = *(prf_node_t **)*id;
    prf_array_free((void *)*id);
    prf_array_free(id);
  }
  return (uint)(iVar7 == 1);
}

Assistant:

bool_t
prf_model_load_with_callback(
    prf_model_t * model,
    bfile_t * bfile,
    prf_cb_t callback )
{
    /* no recursing */
    prf_node_t *** stack;
    prf_state_t * state;
    int level, garbage;

    assert( model != NULL && bfile != NULL );
    assert( model->header == NULL );

    stack = (prf_node_t ***)prf_array_init( 8, sizeof( prf_node_t ** ) );
    assert( stack != NULL );
    stack[0] = (prf_node_t **)prf_array_init( 8, sizeof( prf_node_t * ) );
    assert( stack[0] != NULL );
    level = 0;
    state = prf_state_create();
    assert( state != NULL );
    state->model = model;

    garbage = FALSE;
    while ( !bf_at_eof(bfile) && !garbage) {
        prf_node_t * node;
        prf_nodeinfo_t * info;

        if ( bf_get_remaining_length( bfile ) < 4 ) {
            prf_error( 6, "would reach EOF before reading node header." );
            goto error;
        }

        if ( model->mempool_id == 0 ) {
            node = prf_node_create();
            if ( node == NULL ) {
                prf_error( 6, "could not allocate memory for new node." );
                goto error;
            }
        } else {
            node = (prf_node_t *)pool_malloc(model->mempool_id, sizeof(prf_node_t));
            if ( node == NULL ) {
                prf_error(6, "could not allocate memory for new node.");
                goto error;
            }
            prf_node_clear(node);
            node->flags |= PRF_NODE_MEMPOOLED;
        }

        /* note that this is just a _peek_ to detect some special cases before reading
           in the node. */
        node->opcode = bf_peek_uint16_be(bfile);

        if ( node->opcode == 23 ) {
          prf_error(1, "detected continuation (>= 15.7) - unsupported");
        }

        if ( node->opcode == 0x0000 ||
             node->opcode == 0xa000 ||
             node->opcode == 0x3230 ||
             node->opcode == 11 ) {
          if ( level > 0 && node->opcode == 0x000b ) {
            /* this exception is ok */
          } else {
            prf_error(1, "bogus node opcode 0x%04x at level %d, location %d/%d",
             node->opcode, level, bf_get_position(bfile), bf_get_length(bfile));
            if ( level == 0 ) {
              garbage = TRUE;
              goto nullskip;
            } else {
              prf_error(1, "since level != 0, can't assume trailing garbage");
              assert(0);
            }
          }
        }

        if ( node->opcode == 0x0b00 ) {
          /* bugfix: this opcode is byteswapped and needs to be flipped.
             we fix it by read in the int32, flip it and then push it back on the stream
             and continue as usual. */
          uint32_t nodedata, temp1, temp2;
          nodedata = bf_get_uint32_be(bfile);
          temp1 = nodedata & 0xff00ff00;
          temp2 = nodedata & 0x00ff00ff;
          nodedata = (temp1 >> 8) | (temp2 << 8);
          bf_unget_uint32_be(bfile, nodedata);
          node->opcode = bf_peek_uint16_be(bfile);
        }

        info = prf_nodeinfo_get( node->opcode );
        if ( (info != NULL) && (info->load_f != NULL) ) {
            state->node = node;
            if ( ! (*(info->load_f))(node, state, bfile) )
                goto error;
        } else { /* unsupported node */
            node->opcode = bf_get_uint16_be( bfile );
            node->length = bf_get_uint16_be( bfile );
            if ( node->length > (bf_get_remaining_length( bfile ) + 4) )
                goto error;
            if ( node->length > 4 ) {
                if ( model->mempool_id == 0 ) {
                    node->data = (uint8_t *)malloc( node->length - 4 );
                } else {
                    node->data = (uint8_t *)pool_malloc( model->mempool_id,
                        node->length - 4 );
                    node->flags |= PRF_NODE_MEMPOOLED;
                }
                assert( node->data != NULL );
                bf_read( bfile, node->data, node->length - 4 );
            }
        }
        if ( info != NULL )
            prf_debug( 1, "node loaded: \"%s\"", info->name );
        else
            prf_debug( 1, "node loaded: opcode %d, length %d", node->opcode,
                node->length );

        assert(info != NULL);
        /* insert the node in the model */
        if ( ((info->flags & PRF_PUSH_NODE) != 0) ||
             ((info->flags & PRF_ANCILLARY) != 0) ) {
            int cnt;
            cnt = prf_array_count( stack[level] );
            if ( (stack[level])[cnt-1]->children == NULL ) {
                stack = (prf_node_t ***)prf_array_set_count( stack, level+1 );
                stack = (prf_node_t ***)prf_array_append_ptr( stack, NULL );
                stack[level+1] = 
		  (prf_node_t **)prf_array_init( 8, sizeof( prf_node_t * ) );
            }
            if ( (info->flags & PRF_PUSH_NODE) != 0 )
                level++;
        }

        if ( (info->flags & PRF_ANCILLARY) != 0 ) {
            int cnt, anodes, i;
            assert( stack[level+1] != NULL );
            stack[level+1] = 
	      (prf_node_t **)prf_array_append_ptr( stack[level+1], node );
            assert( level >= 0 );
            cnt = prf_array_count( stack[level] );
            stack[level][cnt-1]->children = (prf_node_t **) stack[level+1];
            anodes = prf_array_count( stack[level+1] );
            for ( i = 0; i < anodes; i++ )
                stack[level+1][i]->parent = stack[level][cnt-1];
        } else {
            assert( stack[level] != NULL );
            stack[level] = 
	      (prf_node_t **)prf_array_append_ptr( stack[level], node );
        }

        prf_cb_call( callback, node );

        if ( (info->flags & PRF_POP_NODE) != 0 ) {
            int cnt, children, i;
            assert(level > 0);
            cnt = prf_array_count( stack[level-1] );
            stack[level-1][cnt-1]->children = (prf_node_t **) stack[level];
            children = prf_array_count( stack[level] );
            for ( i = 0; i < children; i++ )
                stack[level][i]->parent = stack[level-1][cnt-1];
            level--;
        }
nullskip:
	;
    } /* while ( ! bf_at_eof( bfile ) ) */

    if ( level > 0 )
        prf_warn( 6, "loading model left state on level %d.", level );

    prf_state_destroy( state );
    if ( prf_array_count( stack[0] ) != 1 ) {
        prf_error( 8, "model got multiple %d root nodes",
            prf_array_count( stack[0] ) );
        return FALSE;
    }

    assert( prf_array_count( stack ) > 0 &&
        stack[0] != NULL && prf_array_count( stack[0] ) > 0 );
    model->header = stack[0][0];
    prf_array_free( stack[0] );
    prf_array_free( stack );
    return TRUE;

error:
    do {
        uint16_t opcode;
        uint16_t length;
        prf_nodeinfo_t * info;
        opcode = bf_get_uint16_be( bfile );
        length = bf_get_uint16_be( bfile );
        bf_rewind( bfile, 4 );
        info = prf_nodeinfo_get( opcode );
        prf_error( 9, "could not load model database." );
        if ( info != NULL ) {
            prf_error( 6, "  failed while loading node \"%s\" (%d), length: %d",
                info->name, opcode, length );
        } else {
            prf_error( 6,
                "  failed while loading node with opcode %d, length: %d",
                opcode, length );
        }
        prf_error( 6, "  file: \"%s\", position: %d (of %d)",
            bf_get_filename( bfile ), bf_get_position( bfile ),
            bf_get_length( bfile ) );

        prf_debug( 6, "dumping node data" );
        bf_hex_dump( bfile, stderr, length, 4 );
    } while ( FALSE );
    return FALSE;
}